

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O3

void __thiscall METADemuxer::~METADemuxer(METADemuxer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppFVar2;
  FileListIterator *pFVar3;
  pointer pcVar4;
  FileListIterator **m_iterator;
  pointer ppFVar5;
  
  readClose(this);
  ppFVar2 = (this->m_iterators).
            super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppFVar5 = (this->m_iterators).
                 super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppFVar5 != ppFVar2; ppFVar5 = ppFVar5 + 1) {
    pFVar3 = *ppFVar5;
    if (pFVar3 != (FileListIterator *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pFVar3->m_files);
    }
    operator_delete(pFVar3,0x28);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->m_processedTracks)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>_>
  ::~_Rb_tree(&(this->m_mplsStreamMap)._M_t);
  std::vector<StreamInfo,_std::allocator<StreamInfo>_>::~vector(&this->m_codecInfo);
  pcVar4 = (this->m_streamName)._M_dataplus._M_p;
  paVar1 = &(this->m_streamName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>,_std::_Select1st<std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>_>_>
  ::~_Rb_tree(&(this->m_containerReader).m_readerInfo._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>_>
  ::~_Rb_tree(&(this->m_containerReader).m_demuxers._M_t);
  ppFVar5 = (this->m_iterators).
            super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppFVar5 != (pointer)0x0) {
    operator_delete(ppFVar5,(long)(this->m_iterators).
                                  super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar5
                   );
  }
  AbstractDemuxer::~AbstractDemuxer(&this->super_AbstractDemuxer);
  return;
}

Assistant:

METADemuxer::~METADemuxer()
{
    readClose();
    for (FileListIterator*& m_iterator : m_iterators) delete m_iterator;
}